

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

Path * __thiscall
kj::Path::evalWin32Impl
          (Path *__return_storage_ptr__,Path *this,Vector<kj::String> *parts,StringPtr path,
          bool fromApi)

{
  String *pSVar1;
  String *pSVar2;
  Path *pPVar3;
  size_t sVar4;
  bool bVar5;
  char *c;
  long lVar6;
  size_t extraout_RDX;
  char (*params) [3];
  Path *this_00;
  char *pcVar7;
  char *pcVar8;
  ArrayPtr<const_char> part;
  ArrayPtr<const_char> part_00;
  StringPtr value;
  ArrayPtr<const_char> part_01;
  ArrayPtr<const_char> part_02;
  char *pcStackY_b0;
  StringPtr local_90;
  Fault f_1;
  String ownPath;
  Fault f;
  Array<kj::String> local_48;
  __off_t __length;
  
  pcVar8 = path.content.ptr;
  ownPath.content.ptr = (char *)0x0;
  ownPath.content.size_ = 0;
  ownPath.content.disposer = (ArrayDisposer *)0x0;
  local_90.content.ptr = (char *)parts;
  local_90.content.size_ = (size_t)pcVar8;
  if ((int)path.content.size_ == 0) {
    StringPtr::findFirst((StringPtr *)&f_1,(char)&local_90);
    if ((char)f_1.exception != '\0') {
      value.content.size_ = (size_t)pcVar8;
      value.content.ptr = (char *)local_90.content.size_;
      heapString((String *)&f_1,(kj *)local_90.content.ptr,value);
      Array<char>::operator=(&ownPath.content,(Array<char> *)&f_1);
      Array<char>::~Array((Array<char> *)&f_1);
      pcVar8 = ownPath.content.ptr + (ownPath.content.size_ - 1);
      pcVar7 = ownPath.content.ptr;
      if (ownPath.content.size_ == 0) {
        pcVar7 = (char *)0x0;
        pcVar8 = (char *)0x0;
      }
      for (; pcVar7 != pcVar8; pcVar7 = pcVar7 + 1) {
        if (*pcVar7 == '/') {
          *pcVar7 = '\\';
        }
      }
      local_90.content.ptr = ownPath.content.ptr;
      if (ownPath.content.size_ == 0) {
        local_90.content.ptr = (char *)(kj *)0x33812f;
      }
      local_90.content.size_ = ownPath.content.size_ + (ownPath.content.size_ == 0);
    }
LAB_0030e712:
    f_1.exception = (Exception *)anon_var_dwarf_5342de;
    bVar5 = StringPtr::startsWith(&local_90,(StringPtr *)&f_1);
    if (bVar5) {
      local_90.content.ptr = local_90.content.ptr + 2;
      local_90.content.size_ = local_90.content.size_ + -2;
    }
    else {
      f_1.exception = (Exception *)0x37f17b;
      bVar5 = StringPtr::startsWith(&local_90,(StringPtr *)&f_1);
      if (bVar5) {
        if ((char)path.content.size_ != '\0') {
          _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[39]>
                    (&f_1,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                     ,0x177,FAILED,"!fromApi","\"parseWin32Api() requires absolute path\"",
                     (char (*) [39])"parseWin32Api() requires absolute path");
          _::Debug::Fault::fatal(&f_1);
        }
        pSVar1 = (this->parts).ptr;
        pSVar2 = (String *)(this->parts).size_;
        lVar6 = (long)pSVar2 - (long)pSVar1;
        part.size_ = lVar6 % 0x18;
        if (pSVar2 == pSVar1) {
LAB_0030e901:
          _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26],kj::StringPtr&>
                    (&f,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                     ,0x182,FAILED,(char *)0x0,"\"must specify drive letter\", path",
                     (char (*) [26])"must specify drive letter",&local_90);
          ArrayBuilder<kj::String>::clear((ArrayBuilder<kj::String> *)this);
          str<char_const(&)[3]>((String *)&f_1,(kj *)"c:",params);
          Vector<kj::String>::add<kj::String>((Vector<kj::String> *)this,(String *)&f_1);
          Array<char>::~Array((Array<char> *)&f_1);
          _::Debug::Fault::~Fault(&f);
        }
        else {
          pPVar3 = (Path *)(pSVar1->content).size_;
          this_00 = pPVar3;
          if (pPVar3 != (Path *)0x0) {
            this_00 = (Path *)(pSVar1->content).ptr;
          }
          pcVar8 = (char *)0x0;
          if (pPVar3 != (Path *)0x0) {
            pcVar8 = (char *)((long)&pPVar3[-1].parts.disposer + 7);
          }
          part.ptr = pcVar8;
          bVar5 = isWin32Drive(this_00,part);
          if (bVar5) {
            pcStackY_b0 = (char *)0x1;
          }
          else {
            if ((ulong)(lVar6 / 0x18) < 2) goto LAB_0030e901;
            pcStackY_b0 = (char *)0x2;
          }
          ArrayBuilder<kj::String>::truncate((ArrayBuilder<kj::String> *)this,pcStackY_b0,__length);
        }
        goto LAB_0030e74f;
      }
      if ((((char *)(local_90.content.size_ + -1) != (char *)0x2) &&
          (((char *)(local_90.content.size_ + -1) < (char *)0x3 ||
           (*(kj *)(local_90.content.ptr + 2) != (kj)0x5c)))) ||
         (part_00.size_ = extraout_RDX, part_00.ptr = (char *)0x2,
         bVar5 = isWin32Drive((Path *)local_90.content.ptr,part_00), !bVar5)) {
        if ((char)path.content.size_ != '\0') {
          _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[39]>
                    (&f_1,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                     ,0x18e,FAILED,"!fromApi","\"parseWin32Api() requires absolute path\"",
                     (char (*) [39])"parseWin32Api() requires absolute path");
          _::Debug::Fault::fatal(&f_1);
        }
        goto LAB_0030e74f;
      }
    }
  }
  else {
    f_1.exception = (Exception *)anon_var_dwarf_547b9d;
    bVar5 = StringPtr::startsWith(&local_90,(StringPtr *)&f_1);
    if (!bVar5) goto LAB_0030e712;
    local_90.content.ptr = local_90.content.ptr + 4;
    local_90.content.size_ = local_90.content.size_ + -4;
    f_1.exception = (Exception *)anon_var_dwarf_547bb4;
    bVar5 = StringPtr::startsWith(&local_90,(StringPtr *)&f_1);
    if (bVar5) {
      local_90.content.ptr = local_90.content.ptr + 4;
      local_90.content.size_ = local_90.content.size_ + -4;
    }
  }
  ArrayBuilder<kj::String>::clear((ArrayBuilder<kj::String> *)this);
LAB_0030e74f:
  sVar4 = local_90.content.size_;
  pcVar8 = (char *)0x0;
  do {
    pcVar7 = (char *)0x0;
    while( true ) {
      part_01.size_ = pcVar7 + (long)(pcVar8 + (1 - sVar4));
      if (part_01.size_ == (char *)0x0) {
        part_02.size_ = 0;
        part_02.ptr = (char *)(local_90.content.size_ + ~(ulong)pcVar8);
        evalPart(this,(Vector<kj::String> *)(local_90.content.ptr + (long)pcVar8),part_02);
        Vector<kj::String>::releaseAsArray(&local_48,(Vector<kj::String> *)this);
        (__return_storage_ptr__->parts).ptr = local_48.ptr;
        (__return_storage_ptr__->parts).size_ = local_48.size_;
        (__return_storage_ptr__->parts).disposer = local_48.disposer;
        local_48.ptr = (String *)0x0;
        local_48.size_ = 0;
        Array<kj::String>::~Array(&local_48);
        Array<char>::~Array(&ownPath.content);
        return __return_storage_ptr__;
      }
      if (((kj *)(local_90.content.ptr + (long)pcVar8))[(long)pcVar7] == (kj)0x5c) break;
      pcVar7 = pcVar7 + 1;
    }
    part_01.ptr = pcVar7;
    evalPart(this,(Vector<kj::String> *)(local_90.content.ptr + (long)pcVar8),part_01);
    pcVar8 = pcVar7 + (long)(pcVar8 + 1);
  } while( true );
}

Assistant:

Path Path::evalWin32Impl(Vector<String>&& parts, StringPtr path, bool fromApi) {
  // Convert all forward slashes to backslashes.
  String ownPath;
  if (!fromApi && path.findFirst('/') != nullptr) {
    ownPath = heapString(path);
    for (char& c: ownPath) {
      if (c == '/') c = '\\';
    }
    path = ownPath;
  }

  // Interpret various forms of absolute paths.
  if (fromApi && path.startsWith("\\\\?\\")) {
    path = path.slice(4);
    if (path.startsWith("UNC\\")) {
      path = path.slice(4);
    }

    // The path is absolute.
    parts.clear();
  } else if (path.startsWith("\\\\")) {
    // UNC path.
    path = path.slice(2);

    // This path is absolute. The first component is a server name.
    parts.clear();
  } else if (path.startsWith("\\")) {
    KJ_REQUIRE(!fromApi, "parseWin32Api() requires absolute path");

    // Path is relative to the current drive / network share.
    if (parts.size() >= 1 && isWin32Drive(parts[0])) {
      // Leading \ interpreted as root of current drive.
      parts.truncate(1);
    } else if (parts.size() >= 2) {
      // Leading \ interpreted as root of current network share (which is indicated by the first
      // *two* components of the path).
      parts.truncate(2);
    } else {
      KJ_FAIL_REQUIRE("must specify drive letter", path) {
        // Recover by assuming C drive.
        parts.clear();
        parts.add(kj::str("c:"));
        break;
      }
    }
  } else if ((path.size() == 2 || (path.size() > 2 && path[2] == '\\')) &&
             isWin32Drive(path.slice(0, 2))) {
    // Starts with a drive letter.
    parts.clear();
  } else {
    KJ_REQUIRE(!fromApi, "parseWin32Api() requires absolute path");
  }

  size_t partStart = 0;
  for (auto i: kj::indices(path)) {
    if (path[i] == '\\') {
      evalPart(parts, path.slice(partStart, i));
      partStart = i + 1;
    }
  }
  evalPart(parts, path.slice(partStart));

  return Path(parts.releaseAsArray(), Path::ALREADY_CHECKED);
}